

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseDispatch<void>::
     call<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>,tst_qpromise_then::resolveSync()::__2>
               (QPromiseResolve<void> *resolve,QPromiseReject<void> *reject,
               anon_class_8_1_70098e60 fn)

{
  QPromiseReject<void> *reject_local;
  QPromiseResolve<void> *resolve_local;
  anon_class_8_1_70098e60 fn_local;
  
  resolve_local = (QPromiseResolve<void> *)fn.values;
  tst_qpromise_then::resolveSync::anon_class_8_1_70098e60::operator()
            ((anon_class_8_1_70098e60 *)&resolve_local);
  QtPromise::QPromiseResolve<void>::operator()(resolve);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            fn(std::forward<Args>(args)...);
            resolve();
        } catch (...) {
            reject(std::current_exception());
        }
    }